

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

IVec2 __thiscall
vkt::memory::anon_unknown_0::findImageSizeWxHx4(anon_unknown_0 *this,VkDeviceSize size)

{
  ulong uVar1;
  undefined4 uVar2;
  ulong uVar3;
  VkDeviceSize w;
  ulong uVar4;
  
  uVar3 = size >> 2;
  uVar4 = 1;
  uVar2 = 0xffffffff;
  do {
    if ((0xfff < uVar4) || (uVar3 <= uVar4)) {
      uVar1 = 0xffffffff;
LAB_00652db1:
      *(undefined4 *)this = uVar2;
      *(int *)(this + 4) = (int)uVar1;
      return (IVec2)(int  [2])this;
    }
    uVar1 = uVar3 / uVar4;
    if ((uVar1 < 0x1000) && (uVar3 % uVar4 == 0)) {
      uVar2 = (undefined4)uVar4;
      goto LAB_00652db1;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

IVec2 findImageSizeWxHx4 (vk::VkDeviceSize size)
{
	const vk::VkDeviceSize	maxTextureSize	= 4096;
	vk::VkDeviceSize		texelCount		= size / 4;

	DE_ASSERT((size % 4) == 0);

	// \todo [2016-03-09 mika] Could probably be faster?
	for (vk::VkDeviceSize w = 1; w < maxTextureSize && w < texelCount; w++)
	{
		const vk::VkDeviceSize	h	= texelCount / w;

		if ((texelCount  % w) == 0 && h < maxTextureSize)
			return IVec2((int)w, (int)h);
	}

	DE_FATAL("Invalid size");
	return IVec2(-1, -1);
}